

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O0

int run_test_poll_oob(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int *piVar3;
  bool bVar4;
  uv_loop_t *loop;
  undefined1 local_18 [4];
  int r;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xa8,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&server_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xab,"0 == uv_tcp_init(loop, &server_handle)");
    abort();
  }
  iVar1 = uv_tcp_init(puVar2,&client_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xac,"0 == uv_tcp_init(loop, &client_handle)");
    abort();
  }
  iVar1 = uv_tcp_init(puVar2,&peer_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xad,"0 == uv_tcp_init(loop, &peer_handle)");
    abort();
  }
  iVar1 = uv_idle_init(puVar2,&idle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xae,"0 == uv_idle_init(loop, &idle)");
    abort();
  }
  iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)local_18,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xaf,"0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xb0,"0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb)");
    abort();
  }
  iVar1 = uv_tcp_nodelay(&client_handle,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xb3,"0 == uv_tcp_nodelay(&client_handle, 1)");
    abort();
  }
  client_fd = socket(2,1,0);
  if (client_fd < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xb6,"client_fd >= 0");
    abort();
  }
  do {
    piVar3 = __errno_location();
    *piVar3 = 0;
    iVar1 = connect(client_fd,(sockaddr *)local_18,0x10);
    bVar4 = false;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xbb,"r == 0");
    abort();
  }
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xbd,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (ticks != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xbf,"ticks == kMaxTicks");
    abort();
  }
  if (cli_pr_check != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xc2,"cli_pr_check == 1");
    abort();
  }
  if (cli_rd_check != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0xc4,"cli_rd_check == 2");
    abort();
  }
  if (srv_rd_check != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,200,"srv_rd_check == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
          ,0xca,"0 == uv_loop_close(uv_default_loop())");
  abort();
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT(client_fd >= 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT(r == 0);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT(cli_pr_check == 1);
  /* Did client receive the POLLIN message */
  ASSERT(cli_rd_check == 2);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT(srv_rd_check == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}